

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_wal_checkpoint_v2(sqlite3 *db,char *zDb,int eMode,int *pnLog,int *pnCkpt)

{
  int iVar1;
  undefined4 *in_RCX;
  int in_EDX;
  char *in_RSI;
  sqlite3 *in_RDI;
  sqlite3 *in_R8;
  int iDb;
  int rc;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  uVar3 = 0xaaaaaaaa;
  uVar2 = 0xaaaaaaaa;
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0xffffffff;
  }
  if (in_R8 != (sqlite3 *)0x0) {
    *(undefined4 *)&in_R8->pVfs = 0xffffffff;
  }
  if ((in_EDX < 0) || (3 < in_EDX)) {
    local_4 = sqlite3MisuseError(0);
  }
  else {
    sqlite3_mutex_enter((sqlite3_mutex *)0x14c8a5);
    if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
      iVar1 = 0xc;
    }
    else {
      iVar1 = sqlite3FindDbName(in_R8,(char *)CONCAT44(uVar3,uVar2));
    }
    if (iVar1 < 0) {
      sqlite3ErrorWithMsg(in_RDI,1,"unknown database: %s",in_RSI);
    }
    else {
      (in_RDI->busyHandler).nBusy = 0;
      sqlite3Checkpoint((sqlite3 *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                        (int)((ulong)in_RCX >> 0x20),(int)in_RCX,(int *)in_R8,
                        (int *)CONCAT44(uVar3,iVar1));
      sqlite3Error((sqlite3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc);
    }
    local_4 = sqlite3ApiExit((sqlite3 *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    if (in_RDI->nVdbeActive == 0) {
      (in_RDI->u1).isInterrupted = 0;
    }
    sqlite3_mutex_leave((sqlite3_mutex *)0x14c987);
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_wal_checkpoint_v2(
  sqlite3 *db,                    /* Database handle */
  const char *zDb,                /* Name of attached database (or NULL) */
  int eMode,                      /* SQLITE_CHECKPOINT_* value */
  int *pnLog,                     /* OUT: Size of WAL log in frames */
  int *pnCkpt                     /* OUT: Total number of frames checkpointed */
){
#ifdef SQLITE_OMIT_WAL
  return SQLITE_OK;
#else
  int rc;                         /* Return code */
  int iDb;                        /* Schema to checkpoint */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif

  /* Initialize the output variables to -1 in case an error occurs. */
  if( pnLog ) *pnLog = -1;
  if( pnCkpt ) *pnCkpt = -1;

  assert( SQLITE_CHECKPOINT_PASSIVE==0 );
  assert( SQLITE_CHECKPOINT_FULL==1 );
  assert( SQLITE_CHECKPOINT_RESTART==2 );
  assert( SQLITE_CHECKPOINT_TRUNCATE==3 );
  if( eMode<SQLITE_CHECKPOINT_PASSIVE || eMode>SQLITE_CHECKPOINT_TRUNCATE ){
    /* EVIDENCE-OF: R-03996-12088 The M parameter must be a valid checkpoint
    ** mode: */
    return SQLITE_MISUSE_BKPT;
  }

  sqlite3_mutex_enter(db->mutex);
  if( zDb && zDb[0] ){
    iDb = sqlite3FindDbName(db, zDb);
  }else{
    iDb = SQLITE_MAX_DB;   /* This means process all schemas */
  }
  if( iDb<0 ){
    rc = SQLITE_ERROR;
    sqlite3ErrorWithMsg(db, SQLITE_ERROR, "unknown database: %s", zDb);
  }else{
    db->busyHandler.nBusy = 0;
    rc = sqlite3Checkpoint(db, iDb, eMode, pnLog, pnCkpt);
    sqlite3Error(db, rc);
  }
  rc = sqlite3ApiExit(db, rc);

  /* If there are no active statements, clear the interrupt flag at this
  ** point.  */
  if( db->nVdbeActive==0 ){
    AtomicStore(&db->u1.isInterrupted, 0);
  }

  sqlite3_mutex_leave(db->mutex);
  return rc;
#endif
}